

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testMagic.cpp
# Opt level: O2

void anon_unknown.dwarf_19178f::testFile2(char *fileName,bool exists,bool exrFile,bool tiledFile)

{
  uint __line;
  bool bVar1;
  char cVar2;
  ostream *poVar3;
  long lVar4;
  char *pcVar5;
  bool tiled;
  StdIFStream is;
  
  poVar3 = std::operator<<((ostream *)&std::cout,fileName);
  std::operator<<(poVar3," ");
  std::ostream::flush();
  cVar2 = Imf_3_4::isOpenExrFile(fileName,&tiled);
  bVar1 = tiled;
  if (((bool)cVar2 == exrFile) && (tiled == tiledFile)) {
    cVar2 = Imf_3_4::isOpenExrFile(fileName);
    if ((bool)cVar2 == exrFile) {
      tiled = (bool)Imf_3_4::isTiledOpenExrFile(fileName);
      if (tiled == tiledFile) {
        if (!exists) {
          pcVar5 = "does not exist";
LAB_0015ff13:
          poVar3 = std::operator<<((ostream *)&std::cout,pcVar5);
          poVar3 = std::operator<<(poVar3,", ");
          pcVar5 = "is not an OpenEXR file";
          if (exrFile) {
            pcVar5 = "is an OpenEXR file";
          }
          poVar3 = std::operator<<(poVar3,pcVar5);
          poVar3 = std::operator<<(poVar3,", ");
          pcVar5 = "is not tiled";
          if (tiledFile) {
            pcVar5 = "is tiled";
          }
          poVar3 = std::operator<<(poVar3,pcVar5);
          std::endl<char,std::char_traits<char>>(poVar3);
          return;
        }
        Imf_3_4::StdIFStream::StdIFStream(&is,fileName);
        cVar2 = Imf_3_4::isOpenExrFile((IStream *)&is,&tiled);
        if (((bool)cVar2 == exrFile) && (tiled == bVar1)) {
          if (cVar2 != '\0') {
            lVar4 = Imf_3_4::StdIFStream::tellg();
            if (lVar4 != 0) {
              pcVar5 = "is.tellg () == 0";
              __line = 0x46;
              goto LAB_00160072;
            }
          }
          cVar2 = Imf_3_4::isOpenExrFile((IStream *)&is);
          if ((bool)cVar2 == exrFile) {
            if (cVar2 != '\0') {
              lVar4 = Imf_3_4::StdIFStream::tellg();
              if (lVar4 != 0) {
                pcVar5 = "is.tellg () == 0";
                __line = 0x4b;
                goto LAB_00160072;
              }
            }
            tiled = (bool)Imf_3_4::isTiledOpenExrFile((IStream *)&is);
            if (tiled == tiledFile) {
              if (tiled != false) {
                lVar4 = Imf_3_4::StdIFStream::tellg();
                if (lVar4 != 0) {
                  pcVar5 = "is.tellg () == 0";
                  __line = 0x50;
                  goto LAB_00160072;
                }
              }
              Imf_3_4::StdIFStream::~StdIFStream(&is);
              pcVar5 = "exists";
              goto LAB_0015ff13;
            }
            pcVar5 = "tiled == tiledFile";
            __line = 0x4e;
          }
          else {
            pcVar5 = "exr == exrFile";
            __line = 0x49;
          }
        }
        else {
          pcVar5 = "exr == exrFile && tiled == tiledFile";
          __line = 0x44;
        }
      }
      else {
        pcVar5 = "tiled == tiledFile";
        __line = 0x3d;
      }
    }
    else {
      pcVar5 = "exr == exrFile";
      __line = 0x3a;
    }
  }
  else {
    pcVar5 = "exr == exrFile && tiled == tiledFile";
    __line = 0x37;
  }
LAB_00160072:
  __assert_fail(pcVar5,
                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testMagic.cpp"
                ,__line,"void (anonymous namespace)::testFile2(const char *, bool, bool, bool)");
}

Assistant:

void
testFile2 (const char fileName[], bool exists, bool exrFile, bool tiledFile)
{
    cout << fileName << " " << flush;

    bool exr, tiled;

    exr = isOpenExrFile (fileName, tiled);
    assert (exr == exrFile && tiled == tiledFile);

    exr = isOpenExrFile (fileName);
    assert (exr == exrFile);

    tiled = isTiledOpenExrFile (fileName);
    assert (tiled == tiledFile);

    if (exists)
    {
        StdIFStream is (fileName);

        exr = isOpenExrFile (is, tiled);
        assert (exr == exrFile && tiled == tiledFile);

        if (exr) assert (is.tellg () == 0);

        exr = isOpenExrFile (is);
        assert (exr == exrFile);

        if (exr) assert (is.tellg () == 0);

        tiled = isTiledOpenExrFile (is);
        assert (tiled == tiledFile);

        if (tiled) assert (is.tellg () == 0);
    }

    cout << (exists ? "exists" : "does not exist") << ", "
         << (exrFile ? "is an OpenEXR file" : "is not an OpenEXR file") << ", "
         << (tiledFile ? "is tiled" : "is not tiled") << endl;
}